

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

void uv__iou_init(int epollfd,uv__iou *iou,uint32_t entries,uint32_t flags)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t local_f0;
  void *pvStack_e0;
  int ringfd;
  char *sqe;
  char *sq;
  size_t sStack_c8;
  uint32_t i;
  size_t sqelen;
  size_t maxlen;
  size_t sqlen;
  size_t cqlen;
  int local_a0;
  epoll_event e;
  uv__io_uring_params params;
  uint32_t flags_local;
  uint32_t entries_local;
  uv__iou *iou_local;
  int epollfd_local;
  
  sqe = (char *)0xffffffffffffffff;
  pvStack_e0 = (void *)0xffffffffffffffff;
  iVar1 = uv__use_io_uring();
  if (iVar1 == 0) {
    return;
  }
  memset(&e.data,0,0x78);
  iVar1 = uv__io_uring_setup(entries,(uv__io_uring_params *)&e.data);
  if (iVar1 == -1) {
    return;
  }
  if ((((params.sq_thread_cpu & 0x400) != 0) && ((params.sq_thread_cpu & 1) != 0)) &&
     ((params.sq_thread_cpu & 2) != 0)) {
    uVar4 = (ulong)params.sq_off.flags + (ulong)e.data.u32 * 4;
    uVar5 = (ulong)params.cq_off.ring_entries + (ulong)(uint)e.data.u64._4_4_ * 0x10;
    local_f0 = uVar4;
    if (uVar4 < uVar5) {
      local_f0 = uVar5;
    }
    sqelen = local_f0;
    sStack_c8 = (ulong)e.data.u32 << 6;
    sqe = (char *)mmap64((void *)0x0,local_f0,3,0x8001,iVar1,0);
    pvStack_e0 = mmap64((void *)0x0,sStack_c8,3,0x8001,iVar1,0x10000000);
    if ((sqe != (char *)0xffffffffffffffff) && (pvStack_e0 != (void *)0xffffffffffffffff)) {
      if ((flags & 2) != 0) {
        memset((void *)((long)&cqlen + 4),0,0xc);
        cqlen._4_4_ = 1;
        local_a0 = iVar1;
        iVar2 = epoll_ctl(epollfd,1,iVar1,(epoll_event *)((long)&cqlen + 4));
        if (iVar2 != 0) goto LAB_00127146;
      }
      iou->sqhead = (uint32_t *)(sqe + params.reserved[2]);
      iou->sqtail = (uint32_t *)(sqe + params.reserved[3]);
      iou->sqmask = *(uint32_t *)(sqe + params.sq_off.head);
      iou->sqarray = (uint32_t *)(sqe + params.sq_off.flags);
      iou->sqflags = (uint32_t *)(sqe + params.sq_off.ring_mask);
      iou->cqhead = (uint32_t *)(sqe + (uint)params.sq_off.reserved1);
      iou->cqtail = (uint32_t *)(sqe + params.sq_off.reserved1._4_4_);
      iou->cqmask = *(uint32_t *)(sqe + params.cq_off.head);
      iou->sq = sqe;
      iou->cqe = sqe + params.cq_off.ring_entries;
      iou->sqe = pvStack_e0;
      iou->sqlen = uVar4;
      iou->cqlen = uVar5;
      iou->maxlen = local_f0;
      iou->sqelen = sStack_c8;
      iou->ringfd = iVar1;
      iou->in_flight = 0;
      iou->flags = 0;
      uVar3 = uv__kernel_version();
      if (0x50eff < uVar3) {
        iou->flags = iou->flags | 1;
      }
      for (sq._4_4_ = 0; sq._4_4_ <= iou->sqmask; sq._4_4_ = sq._4_4_ + 1) {
        iou->sqarray[sq._4_4_] = sq._4_4_;
      }
      return;
    }
  }
LAB_00127146:
  if (sqe != (char *)0xffffffffffffffff) {
    munmap(sqe,sqelen);
  }
  if (pvStack_e0 != (void *)0xffffffffffffffff) {
    munmap(pvStack_e0,sStack_c8);
  }
  uv__close(iVar1);
  return;
}

Assistant:

static void uv__iou_init(int epollfd,
                         struct uv__iou* iou,
                         uint32_t entries,
                         uint32_t flags) {
  struct uv__io_uring_params params;
  struct epoll_event e;
  size_t cqlen;
  size_t sqlen;
  size_t maxlen;
  size_t sqelen;
  uint32_t i;
  char* sq;
  char* sqe;
  int ringfd;

  sq = MAP_FAILED;
  sqe = MAP_FAILED;

  if (!uv__use_io_uring())
    return;

  /* SQPOLL required CAP_SYS_NICE until linux v5.12 relaxed that requirement.
   * Mostly academic because we check for a v5.13 kernel afterwards anyway.
   */
  memset(&params, 0, sizeof(params));
  params.flags = flags;

  if (flags & UV__IORING_SETUP_SQPOLL)
    params.sq_thread_idle = 10;  /* milliseconds */

  /* Kernel returns a file descriptor with O_CLOEXEC flag set. */
  ringfd = uv__io_uring_setup(entries, &params);
  if (ringfd == -1)
    return;

  /* IORING_FEAT_RSRC_TAGS is used to detect linux v5.13 but what we're
   * actually detecting is whether IORING_OP_STATX works with SQPOLL.
   */
  if (!(params.features & UV__IORING_FEAT_RSRC_TAGS))
    goto fail;

  /* Implied by IORING_FEAT_RSRC_TAGS but checked explicitly anyway. */
  if (!(params.features & UV__IORING_FEAT_SINGLE_MMAP))
    goto fail;

  /* Implied by IORING_FEAT_RSRC_TAGS but checked explicitly anyway. */
  if (!(params.features & UV__IORING_FEAT_NODROP))
    goto fail;

  sqlen = params.sq_off.array + params.sq_entries * sizeof(uint32_t);
  cqlen =
      params.cq_off.cqes + params.cq_entries * sizeof(struct uv__io_uring_cqe);
  maxlen = sqlen < cqlen ? cqlen : sqlen;
  sqelen = params.sq_entries * sizeof(struct uv__io_uring_sqe);

  sq = mmap(0,
            maxlen,
            PROT_READ | PROT_WRITE,
            MAP_SHARED | MAP_POPULATE,
            ringfd,
            0);  /* IORING_OFF_SQ_RING */

  sqe = mmap(0,
             sqelen,
             PROT_READ | PROT_WRITE,
             MAP_SHARED | MAP_POPULATE,
             ringfd,
             0x10000000ull);  /* IORING_OFF_SQES */

  if (sq == MAP_FAILED || sqe == MAP_FAILED)
    goto fail;

  if (flags & UV__IORING_SETUP_SQPOLL) {
    /* Only interested in completion events. To get notified when
     * the kernel pulls items from the submission ring, add POLLOUT.
     */
    memset(&e, 0, sizeof(e));
    e.events = POLLIN;
    e.data.fd = ringfd;

    if (epoll_ctl(epollfd, EPOLL_CTL_ADD, ringfd, &e))
      goto fail;
  }

  iou->sqhead = (uint32_t*) (sq + params.sq_off.head);
  iou->sqtail = (uint32_t*) (sq + params.sq_off.tail);
  iou->sqmask = *(uint32_t*) (sq + params.sq_off.ring_mask);
  iou->sqarray = (uint32_t*) (sq + params.sq_off.array);
  iou->sqflags = (uint32_t*) (sq + params.sq_off.flags);
  iou->cqhead = (uint32_t*) (sq + params.cq_off.head);
  iou->cqtail = (uint32_t*) (sq + params.cq_off.tail);
  iou->cqmask = *(uint32_t*) (sq + params.cq_off.ring_mask);
  iou->sq = sq;
  iou->cqe = sq + params.cq_off.cqes;
  iou->sqe = sqe;
  iou->sqlen = sqlen;
  iou->cqlen = cqlen;
  iou->maxlen = maxlen;
  iou->sqelen = sqelen;
  iou->ringfd = ringfd;
  iou->in_flight = 0;
  iou->flags = 0;

  if (uv__kernel_version() >= /* 5.15.0 */ 0x050F00)
    iou->flags |= UV__MKDIRAT_SYMLINKAT_LINKAT;

  for (i = 0; i <= iou->sqmask; i++)
    iou->sqarray[i] = i;  /* Slot -> sqe identity mapping. */

  return;

fail:
  if (sq != MAP_FAILED)
    munmap(sq, maxlen);

  if (sqe != MAP_FAILED)
    munmap(sqe, sqelen);

  uv__close(ringfd);
}